

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2sp_ref.c
# Opt level: O1

int blake2sp_final(blake2sp_state *S,void *out,size_t outlen)

{
  int iVar1;
  size_t inlen;
  ulong uVar2;
  long lVar3;
  blake2sp_state *S_00;
  undefined1 *out_00;
  uint8_t hash [8] [32];
  undefined1 local_138 [264];
  
  iVar1 = -1;
  if ((out != (void *)0x0) && (S->outlen <= outlen)) {
    out_00 = local_138;
    lVar3 = 0;
    uVar2 = 0;
    S_00 = S;
    do {
      if (uVar2 < S->buflen) {
        inlen = S->buflen + lVar3;
        if (0x3f < inlen) {
          inlen = 0x40;
        }
        blake2s_update((blake2s_state *)S_00,S->buf + uVar2,inlen);
      }
      blake2s_final((blake2s_state *)S_00,out_00,0x20);
      uVar2 = uVar2 + 0x40;
      out_00 = out_00 + 0x20;
      S_00 = (blake2sp_state *)(S_00->S + 1);
      lVar3 = lVar3 + -0x40;
    } while (uVar2 != 0x200);
    lVar3 = 0;
    do {
      blake2s_update(S->R,local_138 + lVar3,0x20);
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0x100);
    iVar1 = blake2s_final(S->R,out,S->outlen);
  }
  return iVar1;
}

Assistant:

int blake2sp_final( blake2sp_state *S, void *out, size_t outlen )
{
  uint8_t hash[PARALLELISM_DEGREE][BLAKE2S_OUTBYTES];
  size_t i;

  if(out == NULL || outlen < S->outlen) {
    return -1;
  }

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
  {
    if( S->buflen > i * BLAKE2S_BLOCKBYTES )
    {
      size_t left = S->buflen - i * BLAKE2S_BLOCKBYTES;

      if( left > BLAKE2S_BLOCKBYTES ) left = BLAKE2S_BLOCKBYTES;

      blake2s_update( S->S[i], S->buf + i * BLAKE2S_BLOCKBYTES, left );
    }

    blake2s_final( S->S[i], hash[i], BLAKE2S_OUTBYTES );
  }

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
    blake2s_update( S->R, hash[i], BLAKE2S_OUTBYTES );

  return blake2s_final( S->R, out, S->outlen );
}